

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

int dill_scallu(dill_stream_conflict s,void *ptr,char *name,char *arg_str,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.gp_offset = 0x20;
  local_e8.fp_offset = 0x30;
  local_a8 = in_R8;
  local_a0 = in_R9;
  do_vararg_push(s,arg_str,&local_e8);
  iVar1 = (*s->j->calli)(s,5,ptr,name);
  return iVar1;
}

Assistant:

int
dill_scallu(dill_stream s,
            void* ptr,
            const char* name,
            const char* arg_str,
            ...)
{
    int ret_reg;
    va_list ap;
    va_start(ap, arg_str);
    do_vararg_push(s, arg_str, ap);
    ret_reg = s->j->calli(s, DILL_U, ptr, (char*)name);
    va_end(ap);
    return ret_reg;
}